

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

cram_codec *
cram_encoder_init(cram_encoding codec,cram_stats *st,cram_external_type option,void *dat,int version
                 )

{
  long lVar1;
  size_t __n;
  char cVar2;
  int iVar3;
  cram_codec *pcVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  char cVar11;
  long lVar12;
  size_t sVar13;
  undefined4 in_register_0000003c;
  long *plVar14;
  undefined4 in_register_00000084;
  int *piVar15;
  long lVar16;
  int iVar17;
  char *__src;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  
  piVar15 = (int *)CONCAT44(in_register_00000084,version);
  plVar14 = (long *)CONCAT44(in_register_0000003c,codec);
  if ((st == (cram_stats *)0x0) || (st->nvals != 0)) {
    if ((0x385UL >> ((ulong)codec & 0x3f) & 1) != 0) {
      cram_encoder_init_cold_1();
      if (plVar14[3] == 0) {
        iVar17 = *(int *)(*plVar14 + 0x20);
        pcVar4 = (cram_codec *)0xffffffff;
        if (0 < (long)iVar17) {
          lVar9 = 0;
          do {
            lVar16 = *(long *)(plVar14[2] + lVar9 * 8);
            if (((lVar16 != 0) && (*(int *)(lVar16 + 8) == 4)) &&
               (*(int *)(lVar16 + 0xc) == st->freqs[0xd])) {
              if (iVar17 == (int)lVar9) {
                return (cram_codec *)0xffffffff;
              }
              goto LAB_0015822f;
            }
            lVar9 = lVar9 + 1;
          } while (iVar17 != lVar9);
        }
      }
      else {
        lVar16 = *(long *)(plVar14[3] + (long)st->freqs[0xd] * 8);
        if (lVar16 == 0) {
          pcVar4 = (cram_codec *)(ulong)-(uint)(*piVar15 != 0);
        }
        else {
LAB_0015822f:
          iVar17 = *(int *)(lVar16 + 0x1c);
          uVar7 = (ulong)iVar17;
          iVar3 = *(int *)(lVar16 + 0x14);
          lVar9 = (long)iVar3;
          pcVar4 = (cram_codec *)0xffffffff;
          if (iVar17 < iVar3) {
            lVar10 = *(long *)(lVar16 + 0x20);
            __src = (char *)(lVar10 + uVar7);
            uVar8 = *(ulong *)((long)dat + 0x28);
            lVar6 = *(long *)((long)dat + 0x30);
            cVar2 = (char)st->freqs[0xc];
            if (lVar9 - uVar7 < uVar8 - lVar6) {
              lVar12 = *(long *)((long)dat + 0x20);
              lVar6 = lVar6 + lVar12;
              cVar11 = *__src;
              if (iVar17 != iVar3 && cVar11 != cVar2) {
                lVar12 = 0;
                do {
                  *(char *)(lVar6 + lVar12) = cVar11;
                  cVar11 = *(char *)(uVar7 + lVar10 + 1 + lVar12);
                  lVar1 = lVar12 + 1;
                  if (cVar11 == cVar2) break;
                  bVar18 = ~uVar7 + lVar9 != lVar12;
                  lVar12 = lVar1;
                } while (bVar18);
                lVar12 = *(long *)((long)dat + 0x20);
                __src = __src + lVar1;
                lVar6 = lVar6 + lVar1;
              }
              iVar17 = (int)__src;
              *(long *)((long)dat + 0x30) = lVar6 - lVar12;
            }
            else {
              lVar10 = 2;
              sVar13 = 0xffffffffffffffff;
              do {
                __n = sVar13 + 1;
                lVar10 = lVar10 + -2;
                if (__src[sVar13 + 1] == cVar2) break;
                lVar12 = sVar13 + (uVar7 - lVar9);
                sVar13 = __n;
              } while (lVar12 != -1);
              pvVar5 = *(void **)((long)dat + 0x20);
              if (uVar8 <= lVar6 + __n) {
                do {
                  auVar19._8_4_ = (int)(uVar8 >> 0x20);
                  auVar19._0_8_ = uVar8;
                  auVar19._12_4_ = 0x45300000;
                  dVar21 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 1.5;
                  uVar7 = (ulong)dVar21;
                  sVar13 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
                  if (uVar8 == 0) {
                    sVar13 = 0x400;
                  }
                  *(size_t *)((long)dat + 0x28) = sVar13;
                  pvVar5 = realloc(pvVar5,sVar13);
                  *(void **)((long)dat + 0x20) = pvVar5;
                  uVar8 = *(ulong *)((long)dat + 0x28);
                  lVar6 = *(long *)((long)dat + 0x30);
                } while (uVar8 <= __n + lVar6);
              }
              iVar17 = (int)__src + (int)__n;
              memcpy((void *)((long)pvVar5 + lVar6),__src,__n);
              uVar7 = *(ulong *)((long)dat + 0x28);
              lVar9 = *(long *)((long)dat + 0x30);
              *(size_t *)((long)dat + 0x30) = lVar9 + __n;
              if (uVar7 <= (ulong)(lVar9 - lVar10)) {
                pvVar5 = *(void **)((long)dat + 0x20);
                do {
                  auVar20._8_4_ = (int)(uVar7 >> 0x20);
                  auVar20._0_8_ = uVar7;
                  auVar20._12_4_ = 0x45300000;
                  dVar21 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
                  uVar8 = (ulong)dVar21;
                  sVar13 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
                  if (uVar7 == 0) {
                    sVar13 = 0x400;
                  }
                  *(size_t *)((long)dat + 0x28) = sVar13;
                  pvVar5 = realloc(pvVar5,sVar13);
                  *(void **)((long)dat + 0x20) = pvVar5;
                  uVar7 = *(ulong *)((long)dat + 0x28);
                } while (uVar7 <= *(long *)((long)dat + 0x30) + __n);
              }
            }
            iVar3 = *(int *)(lVar16 + 0x20);
            *piVar15 = iVar17 - (*(int *)(lVar16 + 0x1c) + iVar3);
            *(int *)(lVar16 + 0x1c) = (iVar17 - iVar3) + 1;
            pcVar4 = (cram_codec *)0x0;
          }
        }
      }
      return pcVar4;
    }
    pcVar4 = (*encode_init[codec])(st,option,dat,version);
    if (pcVar4 != (cram_codec *)0x0) {
      pcVar4->out = (cram_block *)0x0;
      return pcVar4;
    }
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_encoder_init(enum cram_encoding codec,
			      cram_stats *st,
			      enum cram_external_type option,
			      void *dat,
			      int version) {
    if (st && !st->nvals)
	return NULL;

    if (encode_init[codec]) {
	cram_codec *r;
	if ((r = encode_init[codec](st, option, dat, version)))
	    r->out = NULL;
	return r;
    } else {
	fprintf(stderr, "Unimplemented codec of type %s\n", codec2str(codec));
	abort();
    }
}